

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
flow::convert<std::__cxx11::string,flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,flow *this,
          vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *source)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long *local_50 [2];
  long local_40 [2];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,*(long *)(this + 8) - *(long *)this >> 3,
           (allocator_type *)local_50);
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)this;
  if (lVar1 - lVar2 != 0) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      lVar3 = *(long *)(*(long *)this + lVar5 * 8);
      lVar4 = *(long *)(lVar3 + 0x48);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,lVar4,*(long *)(lVar3 + 0x50) + lVar4);
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&(((__return_storage_ptr__->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6),
                 (string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x20;
    } while (lVar1 - lVar2 >> 3 != lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> convert(const std::vector<Constant*>& source) {
  std::vector<T> target(source.size());

  for (size_t i = 0, e = source.size(); i != e; ++i)
    target[i] = static_cast<S*>(source[i])->get();

  return target;
}